

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

uint64_t __thiscall google::protobuf::internal::SerialArena::SpaceAllocated(SerialArena *this)

{
  SerialArena *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->space_allocated_).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

uint64_t SpaceAllocated() const {
    return space_allocated_.load(std::memory_order_relaxed);
  }